

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManPrintMappingStats(Gia_Man_t *p,char *pDumpFile)

{
  int *piVar1;
  undefined8 uVar2;
  char *__s2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *__ptr;
  FILE *__stream;
  int iVar7;
  ulong uVar8;
  abctime aVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  int pFanins [3];
  timespec local_50;
  float local_3c;
  char *local_38;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    return;
  }
  iVar5 = p->nObjs;
  local_38 = pDumpFile;
  __ptr = calloc((long)iVar5,4);
  if ((long)iVar5 < 2) {
    uVar6 = 0;
    bVar16 = true;
    uVar14 = 0;
    uVar13 = 0;
    uVar11 = 0;
  }
  else {
    iVar7 = 0;
    lVar15 = 1;
    uVar10 = 0;
    uVar11 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar6 = 0;
    do {
      iVar5 = p->vMapping->nSize;
      if (iVar5 <= lVar15) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar1 = p->vMapping->pArray;
      uVar3 = piVar1[lVar15];
      uVar8 = (ulong)uVar3;
      if (uVar8 != 0) {
        if (((int)uVar3 < 0) || (iVar5 <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        uVar3 = piVar1[uVar8];
        if ((piVar1 + uVar8)[(long)(int)uVar3 + 1] < 0) {
          if (uVar3 == 2) {
            iVar5 = *(int *)((long)__ptr + lVar15 * 4);
            uVar2 = *(undefined8 *)(p->pObjs + lVar15);
            iVar4 = *(int *)((long)__ptr + (long)(int)((int)lVar15 - ((uint)uVar2 & 0x1fffffff)) * 4
                            );
            if (iVar4 < iVar5) {
              iVar4 = iVar5;
            }
            *(int *)((long)__ptr + lVar15 * 4) = iVar4;
            iVar5 = (int)lVar15 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff);
LAB_0020c6d3:
            iVar5 = *(int *)((long)iVar5 * 4 + (long)__ptr);
            if (iVar5 < iVar4) {
              iVar5 = iVar4;
            }
            *(int *)(lVar15 * 4 + (long)__ptr) = iVar5;
          }
          else if (uVar3 == 3) {
            Gia_ManPrintGetMuxFanins(p,p->pObjs + lVar15,(int *)&local_50);
            iVar5 = *(int *)((long)__ptr + lVar15 * 4);
            iVar4 = *(int *)((long)__ptr + (long)(int)local_50.tv_sec * 4) + 1;
            if (iVar4 < iVar5) {
              iVar4 = iVar5;
            }
            *(int *)((long)__ptr + lVar15 * 4) = iVar4;
            iVar5 = *(int *)((long)__ptr + (long)local_50.tv_sec._4_4_ * 4);
            if (iVar4 <= iVar5) {
              iVar4 = iVar5;
            }
            *(int *)((long)__ptr + lVar15 * 4) = iVar4;
            uVar10 = uVar11;
            iVar5 = (int)local_50.tv_nsec;
            goto LAB_0020c6d3;
          }
          uVar3 = *(uint *)((long)__ptr + lVar15 * 4);
          if ((int)uVar11 <= (int)uVar3) {
            uVar10 = uVar3;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          iVar7 = iVar7 + 1;
          uVar11 = uVar10;
        }
        else {
          if ((int)uVar6 <= (int)uVar3) {
            uVar6 = uVar3;
          }
          if (0 < (int)uVar3) {
            iVar5 = *(int *)((long)__ptr + lVar15 * 4);
            lVar12 = 0;
            do {
              iVar4 = *(int *)((long)__ptr + (long)piVar1[uVar8 + lVar12 + 1] * 4);
              if (iVar5 <= iVar4) {
                iVar5 = iVar4;
              }
              *(int *)((long)__ptr + lVar15 * 4) = iVar5;
              lVar12 = lVar12 + 1;
            } while ((int)uVar3 != lVar12);
          }
          uVar14 = (ulong)((int)uVar14 + 1);
          uVar13 = (ulong)((int)uVar13 + uVar3);
          uVar3 = *(int *)((long)__ptr + lVar15 * 4) + 1;
          *(uint *)((long)__ptr + lVar15 * 4) = uVar3;
          if ((int)uVar11 <= (int)uVar3) {
            uVar11 = uVar3;
            uVar10 = uVar3;
          }
        }
      }
      lVar15 = lVar15 + 1;
      iVar5 = p->nObjs;
    } while (lVar15 < iVar5);
    bVar16 = iVar7 == 0;
  }
  lVar15 = (long)p->vCos->nSize;
  if (lVar15 < 1) {
    local_3c = 0.0;
  }
  else {
    lVar12 = 0;
    iVar7 = 0;
    do {
      iVar4 = p->vCos->pArray[lVar12];
      if (((long)iVar4 < 0) || (iVar5 <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar7 = iVar7 + *(int *)((long)__ptr +
                              (long)(int)(iVar4 - (*(uint *)(p->pObjs + iVar4) & 0x1fffffff)) * 4);
      lVar12 = lVar12 + 1;
    } while (lVar15 != lVar12);
    local_3c = (float)iVar7;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  Abc_Print(1,"Mapping (K=%d)  :  ",(ulong)uVar6);
  Abc_Print(1,"%slut =%7d%s  ","\x1b[1;33m",uVar14,"\x1b[0m");
  Abc_Print(1,"%sedge =%8d%s  ","\x1b[1;32m",uVar13,"\x1b[0m");
  Abc_Print(1,"%slev =%5d%s ","\x1b[1;31m",(ulong)uVar11,"\x1b[0m");
  Abc_Print(1,"%s(%.2f)%s  ",(double)(local_3c / (float)p->vCos->nSize),"\x1b[1;31m","\x1b[0m");
  if (((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) &&
     (iVar5 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar5 != 0)) {
    uVar6 = Gia_ManLutLevelWithBoxes(p);
    Abc_Print(1,"%slevB =%5d%s  ","\x1b[1;31m",(ulong)uVar6,"\x1b[0m");
  }
  Abc_Print(1,"mem =%5.2f MB",
            (double)((int)uVar13 + (int)uVar14 * 2 + p->nObjs) * 4.0 * 9.5367431640625e-07);
  Abc_Print(1,"\n");
  if (!bVar16) {
    Gia_ManCountDupLut(p);
  }
  if (local_38 == (char *)0x0) {
    return;
  }
  __stream = fopen(local_38,"a+");
  __s2 = p->pName;
  iVar5 = strcmp(Gia_ManPrintMappingStats::FileNameOld,__s2);
  if (iVar5 == 0) {
    fputc(0x20,__stream);
    fprintf(__stream,"%d ",uVar14);
    uVar6 = Gia_ManLutLevelWithBoxes(p);
    fprintf(__stream,"%d ",(ulong)uVar6);
    iVar5 = clock_gettime(3,&local_50);
    aVar9 = -1;
    lVar15 = -1;
    if (-1 < iVar5) {
      lVar15 = CONCAT44(local_50.tv_nsec._4_4_,(int)local_50.tv_nsec) / 1000 +
               CONCAT44(local_50.tv_sec._4_4_,(int)local_50.tv_sec) * 1000000;
    }
    fprintf(__stream,"%.2f",(double)(lVar15 - Gia_ManPrintMappingStats::clk) / 1000000.0);
    iVar5 = clock_gettime(3,&local_50);
    if (iVar5 < 0) goto LAB_0020cac0;
  }
  else {
    strcpy(Gia_ManPrintMappingStats::FileNameOld,__s2);
    fputc(10,__stream);
    fprintf(__stream,"%s ",p->pName);
    fputc(0x20,__stream);
    fprintf(__stream,"%d ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
    fprintf(__stream,"%d ",uVar14);
    uVar6 = Gia_ManLutLevelWithBoxes(p);
    fprintf(__stream,"%d ",(ulong)uVar6);
    iVar5 = clock_gettime(3,&local_50);
    if (iVar5 < 0) {
      aVar9 = -1;
      goto LAB_0020cac0;
    }
  }
  aVar9 = CONCAT44(local_50.tv_nsec._4_4_,(int)local_50.tv_nsec) / 1000 +
          CONCAT44(local_50.tv_sec._4_4_,(int)local_50.tv_sec) * 1000000;
LAB_0020cac0:
  Gia_ManPrintMappingStats::clk = aVar9;
  fclose(__stream);
  return;
}

Assistant:

void Gia_ManPrintMappingStats( Gia_Man_t * p, char * pDumpFile )
{
    Gia_Obj_t * pObj;
    int * pLevels;
    int i, k, iFan, nLutSize = 0, nLuts = 0, nFanins = 0, LevelMax = 0, Ave = 0, nMuxF = 0;
    if ( !Gia_ManHasMapping(p) )
        return;
    pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutIsMux(p, i) )
        {
            int pFanins[3];
            if ( Gia_ObjLutSize(p, i) == 3 )
            {
                Gia_ManPrintGetMuxFanins( p, Gia_ManObj(p, i), pFanins );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[0]]+1 );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[1]] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[pFanins[2]] );
            }
            else if ( Gia_ObjLutSize(p, i) == 2 )
            {
                pObj = Gia_ManObj( p, i );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId0(pObj, i)] );
                pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[Gia_ObjFaninId1(pObj, i)] );
            }
            LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
            nFanins++;
            nMuxF++;
            continue;
        }
        nLuts++;
        nFanins += Gia_ObjLutSize(p, i);
        nLutSize = Abc_MaxInt( nLutSize, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
            pLevels[i] = Abc_MaxInt( pLevels[i], pLevels[iFan] );
        pLevels[i]++;
        LevelMax = Abc_MaxInt( LevelMax, pLevels[i] );
    }
    Gia_ManForEachCo( p, pObj, i )
        Ave += pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );

#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    SetConsoleTextAttribute( hConsole, 14 ); // yellow
    Abc_Print( 1, "lut =%7d  ",  nLuts );
    if ( nMuxF )
    Abc_Print( 1, "muxF =%7d  ",  nMuxF );
    SetConsoleTextAttribute( hConsole, 10 ); // green
    Abc_Print( 1, "edge =%8d  ", nFanins );
    SetConsoleTextAttribute( hConsole, 12 ); // red
    Abc_Print( 1, "lev =%5d ",   LevelMax );
    Abc_Print( 1, "(%.2f)  ",    (float)Ave / Gia_ManCoNum(p) );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "levB =%5d  ", Gia_ManLutLevelWithBoxes(p) );
    SetConsoleTextAttribute( hConsole, 7 );  // normal
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
    }
#else
    Abc_Print( 1, "Mapping (K=%d)  :  ", nLutSize );
    Abc_Print( 1, "%slut =%7d%s  ",  "\033[1;33m", nLuts,    "\033[0m" );  // yellow
    Abc_Print( 1, "%sedge =%8d%s  ", "\033[1;32m", nFanins,  "\033[0m" );  // green
    Abc_Print( 1, "%slev =%5d%s ",   "\033[1;31m", LevelMax, "\033[0m" );  // red
    Abc_Print( 1, "%s(%.2f)%s  ",    "\033[1;31m", (float)Ave / Gia_ManCoNum(p), "\033[0m" );
//    Abc_Print( 1, "over =%5.1f %%  ", 100.0 * Gia_ManComputeOverlap(p) / Gia_ManAndNum(p) );
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t *)p->pManTime) )
        Abc_Print( 1, "%slevB =%5d%s  ", "\033[1;31m", Gia_ManLutLevelWithBoxes(p), "\033[0m" );
    Abc_Print( 1, "mem =%5.2f MB", 4.0*(Gia_ManObjNum(p) + 2*nLuts + nFanins)/(1<<20) );
    Abc_Print( 1, "\n" );
#endif

    if ( nMuxF )
        Gia_ManCountDupLut( p );

    //return;
    if ( pDumpFile )
    {
        static char FileNameOld[1000] = {0};
        static abctime clk = 0;
        FILE * pTable = fopen( pDumpFile, "a+" );
        if ( strcmp( FileNameOld, p->pName ) )
        {
            sprintf( FileNameOld, "%s", p->pName );
            fprintf( pTable, "\n" );
            fprintf( pTable, "%s ", p->pName );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", Gia_ManAndNum(p) );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            //fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        else
        {
            //printf( "This part of the code is currently not used.\n" );
            //assert( 0 );
            fprintf( pTable, " " );
            fprintf( pTable, "%d ", nLuts           );
            fprintf( pTable, "%d ", Gia_ManLutLevelWithBoxes(p) );
            //fprintf( pTable, "%d ", Gia_ManRegBoxNum(p) );
            //fprintf( pTable, "%d ", Gia_ManNonRegBoxNum(p) );
            fprintf( pTable, "%.2f", 1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
            clk = Abc_Clock();
        }
        fclose( pTable );
    }

}